

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isLinearMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int iVar1;
  bool isFixedPointDepth;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int j;
  int j_00;
  int iVar8;
  int c;
  int iVar9;
  int c_00;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 depths1;
  Vec4 depths0;
  Vec2 local_d8;
  Vec2 local_d0;
  Vec2 local_c8;
  Vec2 local_c0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level0->m_format);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar10 = floorf(uBounds0.m_data[0] + -0.5);
  fVar11 = floorf(uBounds0.m_data[1] + -0.5);
  fVar12 = floorf(uBounds1.m_data[0] + -0.5);
  fVar13 = floorf(uBounds1.m_data[1] + -0.5);
  fVar14 = floorf(vBounds0.m_data[0] + -0.5);
  c = (int)fVar14;
  fVar14 = floorf(vBounds0.m_data[1] + -0.5);
  iVar9 = (int)fVar14;
  fVar14 = floorf(vBounds1.m_data[0] + -0.5);
  fVar15 = floorf(vBounds1.m_data[1] + -0.5);
  bVar3 = c <= iVar9;
  if (c <= iVar9) {
    iVar8 = (int)fVar15;
    do {
      if ((int)fVar10 <= (int)fVar11) {
        iVar1 = (int)fVar10;
        do {
          fVar23 = uBounds0.m_data[0] + -0.5;
          fVar24 = uBounds0.m_data[1] + -0.5;
          fVar25 = vBounds0.m_data[0] + -0.5;
          fVar26 = vBounds0.m_data[1] + -0.5;
          depths0.m_data[0] = 0.0;
          depths0.m_data[1] = 0.0;
          depths0.m_data[2] = 0.0;
          depths0.m_data[3] = 0.0;
          iVar4 = TexVerifierUtil::wrap(sampler->wrapS,iVar1,dim);
          c_00 = iVar1 + 1;
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,c_00,dim);
          iVar6 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_00);
          iVar7 = TexVerifierUtil::wrap(sampler->wrapT,c + 1,dim_00);
          fVar15 = lookupDepth(level0,sampler,iVar4,iVar6,coordZ);
          depths0.m_data[0] = fVar15;
          fVar15 = lookupDepth(level0,sampler,iVar5,iVar6,coordZ);
          depths0.m_data[1] = fVar15;
          fVar15 = lookupDepth(level0,sampler,iVar4,iVar7,coordZ);
          depths0.m_data[2] = fVar15;
          fVar15 = lookupDepth(level0,sampler,iVar5,iVar7,coordZ);
          depths0.m_data[3] = fVar15;
          if ((int)fVar14 <= iVar8) {
            fVar23 = fVar23 - (float)iVar1;
            fVar15 = 1.0;
            if (fVar23 <= 1.0) {
              fVar15 = fVar23;
            }
            fVar24 = fVar24 - (float)iVar1;
            fVar16 = 1.0;
            if (fVar24 <= 1.0) {
              fVar16 = fVar24;
            }
            fVar25 = fVar25 - (float)c;
            fVar17 = 1.0;
            if (fVar25 <= 1.0) {
              fVar17 = fVar25;
            }
            fVar26 = fVar26 - (float)c;
            fVar18 = 1.0;
            if (fVar26 <= 1.0) {
              fVar18 = fVar26;
            }
            iVar1 = (int)fVar14;
            do {
              iVar5 = iVar1 + 1;
              iVar4 = (int)fVar12;
              while (iVar4 <= (int)fVar13) {
                fVar29 = (uBounds1.m_data[0] + -0.5) - (float)iVar4;
                fVar27 = 1.0;
                if (fVar29 <= 1.0) {
                  fVar27 = fVar29;
                }
                fVar28 = (uBounds1.m_data[1] + -0.5) - (float)iVar4;
                fVar19 = 1.0;
                if (fVar28 <= 1.0) {
                  fVar19 = fVar28;
                }
                fVar30 = (vBounds1.m_data[0] + -0.5) - (float)iVar1;
                fVar20 = 1.0;
                if (fVar30 <= 1.0) {
                  fVar20 = fVar30;
                }
                fVar31 = (vBounds1.m_data[1] + -0.5) - (float)iVar1;
                fVar21 = 1.0;
                if (fVar31 <= 1.0) {
                  fVar21 = fVar31;
                }
                depths1.m_data[0] = 0.0;
                depths1.m_data[1] = 0.0;
                depths1.m_data[2] = 0.0;
                depths1.m_data[3] = 0.0;
                iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar4,dim_01);
                iVar4 = iVar4 + 1;
                iVar7 = TexVerifierUtil::wrap(sampler->wrapS,iVar4,dim_01);
                j = TexVerifierUtil::wrap(sampler->wrapT,iVar1,dim_02);
                j_00 = TexVerifierUtil::wrap(sampler->wrapT,iVar5,dim_02);
                fVar22 = lookupDepth(level1,sampler,iVar6,j,coordZ);
                depths1.m_data[0] = fVar22;
                fVar22 = lookupDepth(level1,sampler,iVar7,j,coordZ);
                depths1.m_data[1] = fVar22;
                fVar22 = lookupDepth(level1,sampler,iVar6,j_00,coordZ);
                depths1.m_data[2] = fVar22;
                fVar22 = lookupDepth(level1,sampler,iVar7,j_00,coordZ);
                depths1.m_data[3] = fVar22;
                local_d8.m_data[0] = (float)(~-(uint)(fVar30 < 0.0) & (uint)fVar20);
                local_d8.m_data[1] = (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar21);
                local_d0.m_data[0] = (float)(~-(uint)(fVar29 < 0.0) & (uint)fVar27);
                local_d0.m_data[1] = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar19);
                local_c8.m_data[0] = (float)(~-(uint)(fVar25 < 0.0) & (uint)fVar17);
                local_c8.m_data[1] = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar18);
                local_c0.m_data[0] = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar15);
                local_c0.m_data[1] = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar16);
                bVar2 = isTrilinearCompareValid
                                  (sampler->compare,prec,&depths0,&depths1,&local_c0,&local_c8,
                                   &local_d0,&local_d8,fBounds,cmpReference,result,isFixedPointDepth
                                  );
                if (bVar2) {
                  if (iVar1 <= iVar8) {
                    return bVar3;
                  }
                  goto LAB_01a0bceb;
                }
              }
              iVar1 = iVar5;
            } while (iVar5 <= iVar8);
          }
LAB_01a0bceb:
          iVar1 = c_00;
        } while (c_00 <= (int)fVar11);
      }
      c = c + 1;
      bVar3 = c <= iVar9;
    } while (c <= iVar9);
  }
  return bVar3;
}

Assistant:

static bool isLinearMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const TexComparePrecision&		prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const float						cmpReference,
													const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int	minI1				= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y()-0.5f);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
			Vec4		depths0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);

				depths0[0] = lookupDepth(level0, sampler, x0, y0, coordZ);
				depths0[1] = lookupDepth(level0, sampler, x1, y0, coordZ);
				depths0[2] = lookupDepth(level0, sampler, x0, y1, coordZ);
				depths0[3] = lookupDepth(level0, sampler, x1, y1, coordZ);
			}

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
					Vec4		depths1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);

						depths1[0] = lookupDepth(level1, sampler, x0, y0, coordZ);
						depths1[1] = lookupDepth(level1, sampler, x1, y0, coordZ);
						depths1[2] = lookupDepth(level1, sampler, x0, y1, coordZ);
						depths1[3] = lookupDepth(level1, sampler, x1, y1, coordZ);
					}

					if (isTrilinearCompareValid(sampler.compare, prec, depths0, depths1,
												Vec2(minA0, maxA0), Vec2(minB0, maxB0),
												Vec2(minA1, maxA1), Vec2(minB1, maxB1),
												fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}